

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineVertexInputTests.cpp
# Opt level: O2

TestCaseGroup * vkt::pipeline::createVertexInputTests(TestContext *testCtx)

{
  undefined8 *puVar1;
  VkFormat VVar2;
  pointer pVVar3;
  undefined8 node;
  _func_int **node_00;
  pointer pGVar4;
  pointer pGVar5;
  TestCaseGroup *pTVar6;
  bool bVar7;
  deUint32 dVar8;
  deUint32 dVar9;
  value_type *__val;
  TestNode *pTVar10;
  TestNode *pTVar11;
  VertexInputTest *pVVar12;
  TestCaseGroup *pTVar13;
  ostream *poVar14;
  deUint32 itemNdx;
  char *description;
  string *description_00;
  ulong uVar15;
  deUint32 resetNdx;
  AttributeInfo *attributeInfo_00;
  AttributeInfo *attributeInfo_01;
  value_type *__value;
  AttributeInfo *attributeInfo_02;
  AttributeInfo *attributeInfo_03;
  value_type *__value_00;
  allocator_type *__a;
  AttributeInfo *extraout_RDX;
  AttributeInfo *extraout_RDX_00;
  AttributeInfo *extraout_RDX_01;
  AttributeInfo *attributeInfo_04;
  AttributeInfo *attributeInfo_05;
  int glslTypeNdx;
  long lVar16;
  VkVertexInputRate *pVVar17;
  pointer this;
  int iVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  GlslType GVar22;
  long lVar23;
  pointer this_00;
  AttributeInfo attributeInfo;
  GlslTypeCombinationsIterator local_638;
  UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> local_5f0;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
  oneToManySequentialAttributeTests;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> oneToManyAttributeTests;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> oneToOneAttributeTests;
  vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
  attributeInfos;
  vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>
  glslTypes;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> vertexInputTests;
  string caseDesc;
  string caseName;
  Random randomFunc;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> bindingOneToOneTests;
  VkFormat vertexFormats [40];
  CompatibleFormats compatibleFormats [22];
  
  pTVar10 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar10,testCtx,"vertex_input","");
  vertexInputTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = (TestCaseGroup *)pTVar10;
  pTVar11 = (TestNode *)operator_new(0x70);
  description = "Uses one attribute";
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar11,testCtx,"single_attribute","Uses one attribute");
  local_638.
  super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
  ._vptr_CombinationsIterator = (_func_int **)pTVar11;
  for (lVar16 = 0;
      node_00 = local_638.
                super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
                ._vptr_CombinationsIterator, lVar16 != 0x44; lVar16 = lVar16 + 1) {
    VVar2 = (&DAT_00975c20)[lVar16];
    for (GVar22 = GLSL_TYPE_INT; GVar22 != GLSL_TYPE_COUNT; GVar22 = GVar22 + GLSL_TYPE_IVEC2) {
      bVar7 = anon_unknown_0::VertexInputTest::isCompatibleType(VVar2,GVar22);
      if (bVar7) {
        attributeInfo.vkType = VVar2;
        attributeInfo.glslType = GVar22;
        attributeInfo.inputRate = VK_VERTEX_INPUT_RATE_VERTEX;
        pVVar12 = (VertexInputTest *)operator_new(0x98);
        (anonymous_namespace)::getAttributeInfoCaseName_abi_cxx11_
                  ((string *)compatibleFormats,(_anonymous_namespace_ *)&attributeInfo,
                   attributeInfo_00);
        (anonymous_namespace)::getAttributeInfoDescription_abi_cxx11_
                  ((string *)&bindingOneToOneTests,(_anonymous_namespace_ *)&attributeInfo,
                   attributeInfo_01);
        std::
        vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
        ::vector((vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
                  *)vertexFormats,(size_type)&attributeInfo,__value,(allocator_type *)description);
        description_00 = (string *)&bindingOneToOneTests;
        anon_unknown_0::VertexInputTest::VertexInputTest
                  (pVVar12,testCtx,(string *)compatibleFormats,description_00,
                   (vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
                    *)vertexFormats,BINDING_MAPPING_ONE_TO_ONE,ATTRIBUTE_LAYOUT_INTERLEAVED);
        tcu::TestNode::addChild(pTVar11,(TestNode *)pVVar12);
        std::
        _Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
        ::~_Vector_base((_Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
                         *)vertexFormats);
        std::__cxx11::string::~string((string *)&bindingOneToOneTests);
        std::__cxx11::string::~string((string *)compatibleFormats);
        attributeInfo.inputRate = VK_VERTEX_INPUT_RATE_INSTANCE;
        pVVar12 = (VertexInputTest *)operator_new(0x98);
        (anonymous_namespace)::getAttributeInfoCaseName_abi_cxx11_
                  ((string *)compatibleFormats,(_anonymous_namespace_ *)&attributeInfo,
                   attributeInfo_02);
        (anonymous_namespace)::getAttributeInfoDescription_abi_cxx11_
                  ((string *)&bindingOneToOneTests,(_anonymous_namespace_ *)&attributeInfo,
                   attributeInfo_03);
        std::
        vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
        ::vector((vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
                  *)vertexFormats,(size_type)&attributeInfo,__value_00,
                 (allocator_type *)description_00);
        description = (char *)&bindingOneToOneTests;
        anon_unknown_0::VertexInputTest::VertexInputTest
                  (pVVar12,testCtx,(string *)compatibleFormats,(string *)description,
                   (vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
                    *)vertexFormats,BINDING_MAPPING_ONE_TO_ONE,ATTRIBUTE_LAYOUT_INTERLEAVED);
        tcu::TestNode::addChild(pTVar11,(TestNode *)pVVar12);
        std::
        _Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
        ::~_Vector_base((_Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
                         *)vertexFormats);
        std::__cxx11::string::~string((string *)&bindingOneToOneTests);
        std::__cxx11::string::~string((string *)compatibleFormats);
      }
    }
  }
  local_638.
  super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
  ._vptr_CombinationsIterator = (_func_int **)0x0;
  tcu::TestNode::addChild(pTVar10,(TestNode *)node_00);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            ((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&local_638);
  pTVar6 = vertexInputTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  memcpy(vertexFormats,&DAT_00975da0,0xa0);
  pTVar10 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar10,testCtx,"multiple_attributes","Uses more than one attribute");
  lVar16 = 8;
  do {
    *(undefined8 *)
     ((long)&compatibleFormats[0].compatibleVkFormats.
             super__Vector_base<vk::VkFormat,_std::allocator<vk::VkFormat>_>._M_impl.
             super__Vector_impl_data._M_finish + lVar16) = 0;
    *(undefined8 *)((long)&compatibleFormats[0].glslType + lVar16) = 0;
    *(undefined8 *)
     ((long)&compatibleFormats[0].compatibleVkFormats.
             super__Vector_base<vk::VkFormat,_std::allocator<vk::VkFormat>_>._M_impl.
             super__Vector_impl_data._M_start + lVar16) = 0;
    lVar16 = lVar16 + 0x20;
  } while (lVar16 != 0x2c8);
  local_5f0.m_data.ptr = (TestCaseGroup *)pTVar10;
  for (lVar16 = 0; lVar16 != 0x16; lVar16 = lVar16 + 1) {
    for (lVar23 = 0; lVar23 != 0xa0; lVar23 = lVar23 + 4) {
      bVar7 = anon_unknown_0::VertexInputTest::isCompatibleType
                        (*(VkFormat *)((long)vertexFormats + lVar23),(GlslType)lVar16);
      if (bVar7) {
        std::vector<vk::VkFormat,_std::allocator<vk::VkFormat>_>::push_back
                  (&compatibleFormats[lVar16].compatibleVkFormats,
                   (value_type *)((long)vertexFormats + lVar23));
      }
    }
  }
  deRandom_init(&randomFunc.m_rnd,0x18e8e);
  local_638.
  super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
  ._vptr_CombinationsIterator = (_func_int **)&PTR__CombinationsIterator_00bf9be0;
  local_638.
  super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
  .m_numItems = 0xf;
  local_638.
  super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
  .m_combinationSize = 3;
  local_638.
  super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
  .m_combination.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_638.
  super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
  .m_combination.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_638.
  super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
  .m_combination.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dVar8 = seriesProduct(0xd,0xf);
  dVar9 = seriesProduct(1,3);
  local_638.
  super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
  .m_combinationCount = dVar8 / dVar9;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&local_638.
              super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
              .m_combination,3);
  for (uVar15 = 0;
      uVar15 < local_638.
               super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
               .m_combinationSize; uVar15 = uVar15 + 1) {
    local_638.
    super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
    .m_combination.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[uVar15] = (uint)uVar15;
  }
  local_638.
  super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
  .m_combinationIndex = 0;
  local_638.
  super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
  ._vptr_CombinationsIterator = (_func_int **)&PTR__GlslTypeCombinationsIterator_00bf9b90;
  local_638.m_combinationValue.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_638.m_combinationValue.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_638.m_combinationValue.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_638.m_combinationValue.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0xc);
  local_638.m_combinationValue.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_638.m_combinationValue.
       super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>
       ._M_impl.super__Vector_impl_data._M_start + 3;
  local_638.m_combinationValue.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>
  ._M_impl.super__Vector_impl_data._M_start[2] = GLSL_TYPE_INT;
  local_638.m_combinationValue.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>
  ._M_impl.super__Vector_impl_data._M_start[0] = GLSL_TYPE_INT;
  local_638.m_combinationValue.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>
  ._M_impl.super__Vector_impl_data._M_start[1] = GLSL_TYPE_INT;
  local_638.m_combinationValue.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_638.m_combinationValue.
       super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  pTVar13 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar13,testCtx,"attributes","");
  oneToOneAttributeTests.
  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr = pTVar13
  ;
  pTVar13 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar13,testCtx,"attributes","");
  oneToManyAttributeTests.
  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr = pTVar13
  ;
  pTVar13 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar13,testCtx,"attributes_sequential","");
  oneToManySequentialAttributeTests.
  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr = pTVar13
  ;
  do {
    if (local_638.
        super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
        .m_combinationCount <=
        local_638.
        super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
        .m_combinationIndex) {
      pTVar11 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar11,testCtx,"binding_one_to_one",
                 "Each attribute uses a unique binding");
      pTVar13 = oneToOneAttributeTests.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
                .ptr;
      oneToOneAttributeTests.
      super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
           (TestCaseGroup *)0x0;
      bindingOneToOneTests.
      super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
           (TestCaseGroup *)pTVar11;
      tcu::TestNode::addChild(pTVar11,&pTVar13->super_TestNode);
      bindingOneToOneTests.
      super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
           (TestCaseGroup *)0x0;
      tcu::TestNode::addChild(pTVar10,pTVar11);
      pTVar11 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar11,testCtx,"binding_one_to_many",
                 "Attributes share the same binding");
      pTVar13 = oneToManyAttributeTests.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
                .ptr;
      oneToManyAttributeTests.
      super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
           (TestCaseGroup *)0x0;
      attributeInfo._0_8_ = pTVar11;
      tcu::TestNode::addChild(pTVar11,&pTVar13->super_TestNode);
      pTVar13 = oneToManySequentialAttributeTests.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
                .ptr;
      oneToManySequentialAttributeTests.
      super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
           (TestCaseGroup *)0x0;
      tcu::TestNode::addChild(pTVar11,&pTVar13->super_TestNode);
      node = attributeInfo._0_8_;
      attributeInfo.glslType = GLSL_TYPE_INT;
      attributeInfo.vkType = VK_FORMAT_UNDEFINED;
      tcu::TestNode::addChild(pTVar10,(TestNode *)node);
      de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
      ~UniqueBase((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                  &attributeInfo);
      de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
      ~UniqueBase(&bindingOneToOneTests.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
      de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
      ~UniqueBase(&oneToManySequentialAttributeTests.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
      de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
      ~UniqueBase(&oneToManyAttributeTests.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
      de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
      ~UniqueBase(&oneToOneAttributeTests.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
      anon_unknown_0::GlslTypeCombinationsIterator::~GlslTypeCombinationsIterator(&local_638);
      lVar16 = 0x2a8;
      do {
        std::_Vector_base<vk::VkFormat,_std::allocator<vk::VkFormat>_>::~_Vector_base
                  ((_Vector_base<vk::VkFormat,_std::allocator<vk::VkFormat>_> *)
                   ((long)&compatibleFormats[0].glslType + lVar16));
        pTVar13 = local_5f0.m_data.ptr;
        lVar16 = lVar16 + -0x20;
      } while (lVar16 != -0x18);
      local_5f0.m_data.ptr = (TestCaseGroup *)0x0;
      tcu::TestNode::addChild(&pTVar6->super_TestNode,&pTVar13->super_TestNode);
      de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
      ~UniqueBase(&local_5f0);
      pTVar6 = vertexInputTests.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr;
      vertexInputTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
      .m_data.ptr = (TestCaseGroup *)0x0;
      de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
      ~UniqueBase(&vertexInputTests.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
      return pTVar6;
    }
    if (local_638.
        super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
        .m_combinationIndex == 0) {
      local_638.
      super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
      .m_combinationIndex = 0;
    }
    else {
      lVar16 = (ulong)local_638.
                      super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
                      .m_combinationSize << 0x20;
      iVar18 = 0;
      uVar15 = (ulong)local_638.
                      super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
                      .m_combinationSize;
      while( true ) {
        uVar19 = (uint)(uVar15 - 1);
        if ((int)uVar19 < 0) break;
        uVar19 = uVar19 & 0x7fffffff;
        uVar20 = local_638.
                 super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
                 .m_combination.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar19] + 1;
        if ((uVar20 < local_638.
                      super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
                      .m_numItems) &&
           ((iVar18 == 0 ||
            (uVar20 < *(uint *)((long)local_638.
                                      super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
                                      .m_combination.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start + (lVar16 >> 0x1e)))
            ))) {
          local_638.
          super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
          .m_combination.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar19] = uVar20;
          for (; uVar15 < local_638.
                          super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
                          .m_combinationSize; uVar15 = uVar15 + 1) {
            local_638.
            super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
            .m_combination.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar15] =
                 local_638.
                 super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
                 .m_combination.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start[(int)uVar15 - 1] + 1;
          }
          break;
        }
        lVar16 = lVar16 + -0x100000000;
        iVar18 = iVar18 + 1;
        uVar15 = uVar15 - 1;
      }
    }
    local_638.
    super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
    .m_combinationIndex =
         local_638.
         super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
         .m_combinationIndex + 1;
    (*local_638.
      super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
      ._vptr_CombinationsIterator[2])
              (&glslTypes,&local_638,
               &local_638.
                super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
                .m_combination);
    pGVar5 = glslTypes.
             super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pGVar4 = glslTypes.
             super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar16 = (long)glslTypes.
                   super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)glslTypes.
                   super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar15 = lVar16 >> 2;
    if (0xaaaaaaaaaaaaaaa < uVar15) {
      std::__throw_length_error("cannot create std::vector larger than max_size()");
    }
    std::
    _Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
    ::_Vector_base(&attributeInfos.
                    super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
                   ,uVar15,__a);
    this_00 = attributeInfos.
              super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
    attributeInfos.
    super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         attributeInfos.
         super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
         ._M_impl.super__Vector_impl_data._M_start;
    if (pGVar5 != pGVar4) {
      (attributeInfos.
       super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
       ._M_impl.super__Vector_impl_data._M_start)->inputRate = VK_VERTEX_INPUT_RATE_VERTEX;
      (attributeInfos.
       super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
       ._M_impl.super__Vector_impl_data._M_start)->glslType = GLSL_TYPE_INT;
      (attributeInfos.
       super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
       ._M_impl.super__Vector_impl_data._M_start)->vkType = VK_FORMAT_UNDEFINED;
      if (lVar16 == 4) {
        attributeInfos.
        super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             attributeInfos.
             super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
             ._M_impl.super__Vector_impl_data._M_start + 1;
      }
      else {
        attributeInfos.
        super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             attributeInfos.
             super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
             ._M_impl.super__Vector_impl_data._M_start + uVar15;
        for (lVar16 = 0xc; uVar15 * 0xc - lVar16 != 0; lVar16 = lVar16 + 0xc) {
          puVar1 = (undefined8 *)
                   ((long)&(attributeInfos.
                            super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start)->glslType + lVar16);
          *(VkVertexInputRate *)(puVar1 + 1) =
               (attributeInfos.
                super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
                ._M_impl.super__Vector_impl_data._M_start)->inputRate;
          *puVar1 = *(undefined8 *)
                     attributeInfos.
                     super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        }
      }
    }
    uVar15 = ((long)attributeInfos.
                    super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)attributeInfos.
                   super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0xc;
    pVVar17 = &(attributeInfos.
                super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
                ._M_impl.super__Vector_impl_data._M_start)->inputRate;
    for (uVar21 = 0; uVar15 != uVar21; uVar21 = uVar21 + 1) {
      GVar22 = glslTypes.
               super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar21];
      dVar8 = deRandom_getUint32(&randomFunc.m_rnd);
      pVVar3 = compatibleFormats[GVar22].compatibleVkFormats.
               super__Vector_base<vk::VkFormat,_std::allocator<vk::VkFormat>_>._M_impl.
               super__Vector_impl_data._M_start;
      VVar2 = pVVar3[(ulong)dVar8 %
                     (ulong)((long)compatibleFormats[GVar22].compatibleVkFormats.
                                   super__Vector_base<vk::VkFormat,_std::allocator<vk::VkFormat>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pVVar3 >> 2)];
      ((AttributeInfo *)(pVVar17 + -2))->glslType =
           glslTypes.
           super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar21];
      *pVVar17 = (VkVertexInputRate)uVar21 & VK_VERTEX_INPUT_RATE_INSTANCE;
      pVVar17[-1] = VVar2;
      pVVar17 = pVVar17 + 3;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&bindingOneToOneTests);
    attributeInfo_04 = extraout_RDX;
    this = this_00;
    for (uVar21 = 0; uVar15 != uVar21; uVar21 = uVar21 + 1) {
      (anonymous_namespace)::getAttributeInfoCaseName_abi_cxx11_
                ((string *)&attributeInfo,(_anonymous_namespace_ *)this,attributeInfo_04);
      std::operator<<((ostream *)&bindingOneToOneTests,(string *)&attributeInfo);
      std::__cxx11::string::~string((string *)&attributeInfo);
      attributeInfo_04 = extraout_RDX_00;
      if (uVar21 < uVar15 - 1) {
        std::operator<<((ostream *)&bindingOneToOneTests,"-");
        attributeInfo_04 = extraout_RDX_01;
      }
      this = this + 1;
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&bindingOneToOneTests);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&bindingOneToOneTests);
    std::operator<<((ostream *)&bindingOneToOneTests,"Uses vertex attributes:\n");
    while (bVar7 = uVar15 != 0, uVar15 = uVar15 - 1, bVar7) {
      poVar14 = std::operator<<((ostream *)&bindingOneToOneTests,"\t- ");
      (anonymous_namespace)::getAttributeInfoDescription_abi_cxx11_
                ((string *)&attributeInfo,(_anonymous_namespace_ *)this_00,attributeInfo_05);
      poVar14 = std::operator<<(poVar14,(string *)&attributeInfo);
      std::operator<<(poVar14,"\n");
      std::__cxx11::string::~string((string *)&attributeInfo);
      this_00 = this_00 + 1;
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&bindingOneToOneTests);
    pTVar13 = oneToOneAttributeTests.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr;
    pVVar12 = (VertexInputTest *)operator_new(0x98);
    anon_unknown_0::VertexInputTest::VertexInputTest
              (pVVar12,testCtx,&caseName,&caseDesc,&attributeInfos,BINDING_MAPPING_ONE_TO_ONE,
               ATTRIBUTE_LAYOUT_INTERLEAVED);
    tcu::TestNode::addChild(&pTVar13->super_TestNode,(TestNode *)pVVar12);
    pTVar13 = oneToManyAttributeTests.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr;
    pVVar12 = (VertexInputTest *)operator_new(0x98);
    anon_unknown_0::VertexInputTest::VertexInputTest
              (pVVar12,testCtx,&caseName,&caseDesc,&attributeInfos,BINDING_MAPPING_ONE_TO_MANY,
               ATTRIBUTE_LAYOUT_INTERLEAVED);
    tcu::TestNode::addChild(&pTVar13->super_TestNode,(TestNode *)pVVar12);
    pTVar13 = oneToManySequentialAttributeTests.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr;
    pVVar12 = (VertexInputTest *)operator_new(0x98);
    anon_unknown_0::VertexInputTest::VertexInputTest
              (pVVar12,testCtx,&caseName,&caseDesc,&attributeInfos,BINDING_MAPPING_ONE_TO_MANY,
               ATTRIBUTE_LAYOUT_SEQUENTIAL);
    tcu::TestNode::addChild(&pTVar13->super_TestNode,(TestNode *)pVVar12);
    std::__cxx11::string::~string((string *)&caseDesc);
    std::__cxx11::string::~string((string *)&caseName);
    std::
    _Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
    ::~_Vector_base(&attributeInfos.
                     super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
                   );
    std::
    vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>
    ::~vector(&glslTypes);
  } while( true );
}

Assistant:

tcu::TestCaseGroup* createVertexInputTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup>	vertexInputTests (new tcu::TestCaseGroup(testCtx, "vertex_input", ""));

	vertexInputTests->addChild(createSingleAttributeTests(testCtx).release());
	vertexInputTests->addChild(createMultipleAttributeTests(testCtx).release());

	return vertexInputTests.release();
}